

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::VerifySignatureTxInRequest::ConvertFromStruct
          (VerifySignatureTxInRequest *this,VerifySignatureTxInRequestStruct *data)

{
  VerifySignatureTxInRequestStruct *data_local;
  VerifySignatureTxInRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)data);
  this->vout_ = data->vout;
  std::__cxx11::string::operator=((string *)&this->signature_,(string *)&data->signature);
  std::__cxx11::string::operator=((string *)&this->pubkey_,(string *)&data->pubkey);
  std::__cxx11::string::operator=((string *)&this->redeem_script_,(string *)&data->redeem_script);
  std::__cxx11::string::operator=((string *)&this->hash_type_,(string *)&data->hash_type);
  std::__cxx11::string::operator=((string *)&this->sighash_type_,(string *)&data->sighash_type);
  this->sighash_anyone_can_pay_ = (bool)(data->sighash_anyone_can_pay & 1);
  this->sighash_rangeproof_ = (bool)(data->sighash_rangeproof & 1);
  this->amount_ = data->amount;
  std::__cxx11::string::operator=
            ((string *)&this->confidential_value_commitment_,
             (string *)&data->confidential_value_commitment);
  std::__cxx11::string::operator=((string *)&this->annex_,(string *)&data->annex);
  this->code_separator_position_ = data->code_separator_position;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void VerifySignatureTxInRequest::ConvertFromStruct(
    const VerifySignatureTxInRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  signature_ = data.signature;
  pubkey_ = data.pubkey;
  redeem_script_ = data.redeem_script;
  hash_type_ = data.hash_type;
  sighash_type_ = data.sighash_type;
  sighash_anyone_can_pay_ = data.sighash_anyone_can_pay;
  sighash_rangeproof_ = data.sighash_rangeproof;
  amount_ = data.amount;
  confidential_value_commitment_ = data.confidential_value_commitment;
  annex_ = data.annex;
  code_separator_position_ = data.code_separator_position;
  ignore_items = data.ignore_items;
}